

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.C
# Opt level: O2

void __thiscall Search::findInFile(Search *this,string *path)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t __n;
  void *pvVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar6;
  Search *pSVar7;
  ulong uVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar9;
  string_view fmt;
  format_args args;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  format_args args_11;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  string local_8c8;
  Search *local_8a0;
  string *local_898;
  uint local_88c;
  Filter *local_888;
  long local_880;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  Match pmatch;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_848;
  size_type sStack_840;
  char s3 [1024];
  char buf [1024];
  
  local_898 = path;
  std::__cxx11::string::string((string *)buf,(path->_M_dataplus)._M_p,(allocator *)&local_8c8);
  std::__cxx11::string::string((string *)s3,"r",(allocator *)&pmatch);
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)Utils::fopen(buf,s3);
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
  super__Tuple_impl<1UL,_void_(*)(_IO_FILE_*)>.super__Head_base<1UL,_void_(*)(_IO_FILE_*),_false>.
  _M_head_impl = (_Head_base<1UL,_void_(*)(_IO_FILE_*),_false>)fclose;
  std::__cxx11::string::~string((string *)s3);
  std::__cxx11::string::~string((string *)buf);
  pFVar1 = _stderr;
  if (f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
      super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
      super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl == (_IO_FILE *)0x0) {
    local_8c8._M_dataplus._M_p = "ERROR:";
    local_8c8._M_string_length = 0xff000000000001;
    local_8c8.field_2._M_local_buf[0] = '\0';
    local_8c8.field_2._M_local_buf[4] = '\0';
    local_8c8.field_2._8_2_ = 1;
    local_8c8.field_2._M_local_buf[10] = '\0';
    piVar6 = __errno_location();
    Utils::strerror_abi_cxx11_((Utils *)&pmatch,*piVar6);
    buf._16_8_ = (local_898->_M_dataplus)._M_p;
    buf._24_8_ = local_898->_M_string_length;
    buf._8_8_ = ::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
                format_custom_arg<fmt::v10::detail::styled_arg<char[7]>,fmt::v10::formatter<fmt::v10::detail::styled_arg<char[7]>,char,void>>
    ;
    buf._32_8_ = pmatch._smatch.
                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    buf._40_8_ = pmatch._smatch.
                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    fmt_03.size_ = 0xddf;
    fmt_03.data_ = (char *)0x1e;
    args_05.field_1.args_ = in_R9.args_;
    args_05.desc_ = (unsigned_long_long)buf;
    buf._0_8_ = &local_8c8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)s3,(v10 *)"{} Failed to open file {} : {}",fmt_03,args_05);
    buf[0] = s3[0];
    buf[1] = s3[1];
    buf[2] = s3[2];
    buf[3] = s3[3];
    buf[4] = s3[4];
    buf[5] = s3[5];
    buf[6] = s3[6];
    buf[7] = s3[7];
    buf[8] = s3[8];
    buf[9] = s3[9];
    buf[10] = s3[10];
    buf[0xb] = s3[0xb];
    buf[0xc] = s3[0xc];
    buf[0xd] = s3[0xd];
    buf[0xe] = s3[0xe];
    buf[0xf] = s3[0xf];
    args_11.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)buf;
    args_11.desc_ = 0xd;
    fmt_09.size_ = 3;
    fmt_09.data_ = "{}\n";
    ::fmt::v10::vprint(pFVar1,fmt_09,args_11);
    std::__cxx11::string::~string((string *)s3);
    std::__cxx11::string::~string((string *)&pmatch);
  }
  else {
    local_888 = &this->_filter;
    local_880 = 0;
    local_88c = (uint)this->_args->_noColor;
    bVar9 = false;
    iVar3 = 0;
    local_8a0 = this;
    do {
      pcVar4 = fgets(buf,0x400,
                     (FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                             super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                             super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      if (pcVar4 == (char *)0x0) break;
      __n = strlen(buf);
      while ((__n != 0 && ((s3[__n + 0x3ff] == '\r' || (s3[__n + 0x3ff] == '\n'))))) {
        s3[__n + 0x3ff] = '\0';
        __n = __n - 1;
      }
      if ((bVar9) || (local_8a0->_args->_ascii != false)) {
        bVar9 = false;
      }
      else {
        pvVar5 = memchr(buf,0,__n);
        bVar9 = pvVar5 != (void *)0x0;
      }
      pmatch._smatch.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pmatch._smatch._M_begin._M_current = (char *)0x0;
      pmatch._smatch.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pmatch._smatch.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::__cxx11::string::string((string *)s3,buf,(allocator *)&local_8c8);
      bVar2 = Filter::matchContent(local_888,(string *)s3,&pmatch);
      local_880 = local_880 + 1;
      std::__cxx11::string::~string((string *)s3);
      if (bVar2) {
        bVar2 = Filter::printContent(local_888);
        pFVar1 = _stdout;
        if (bVar2) {
          if (!bVar9) {
            s3._0_8_ = (local_898->_M_dataplus)._M_p;
            s3._8_8_ = local_898->_M_string_length;
            s3[0x10] = (undefined1)local_880;
            s3[0x11] = local_880._1_1_;
            s3[0x12] = local_880._2_1_;
            s3[0x13] = local_880._3_1_;
            s3[0x14] = local_880._4_1_;
            s3[0x15] = local_880._5_1_;
            s3[0x16] = local_880._6_1_;
            s3[0x17] = local_880._7_1_;
            args.field_1.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)s3;
            args.desc_ = 0x1d;
            fmt_10.size_ = 10;
            fmt_10.data_ = "{} +{} : \"";
            ::fmt::v10::vprint(fmt_10,args);
            iVar3 = (*local_8a0->_vptr_Search[2])(local_8a0,buf,&pmatch);
            for (uVar8 = CONCAT44(extraout_var,iVar3); pFVar1 = _stdout, uVar8 < __n;
                uVar8 = uVar8 + CONCAT44(extraout_var_00,iVar3)) {
              pcVar4 = buf + uVar8;
              std::__cxx11::string::string((string *)s3,pcVar4,(allocator *)&local_8c8);
              bVar2 = Filter::matchContent(local_888,(string *)s3,&pmatch);
              std::__cxx11::string::~string((string *)s3);
              if (!bVar2) {
                Utils::strncpy_s(s3,0x400,pcVar4,0x3ff);
                pFVar1 = _stdout;
                fmt_01.size_ = 0xc;
                fmt_01.data_ = (char *)0x3;
                args_03.field_1.values_ = in_R9.values_;
                args_03.desc_ = (unsigned_long_long)&local_848;
                local_848.values_ =
                     (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)s3;
                ::fmt::v10::vformat_abi_cxx11_(&local_8c8,(v10 *)0x125115,fmt_01,args_03);
                local_848 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                             )local_8c8._M_dataplus._M_p;
                sStack_840 = local_8c8._M_string_length;
                args_09.field_1.values_ =
                     (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_848;
                args_09.desc_ = 0xd;
                fmt_07.size_ = 3;
                fmt_07.data_ = "{}\n";
                ::fmt::v10::vprint(pFVar1,fmt_07,args_09);
                pSVar7 = local_8a0;
                std::__cxx11::string::~string((string *)&local_8c8);
                goto LAB_0010a423;
              }
              iVar3 = (*local_8a0->_vptr_Search[2])(local_8a0,pcVar4,&pmatch);
            }
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)&local_8c8;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)s3,(v10 *)0x126751,(string_view)ZEXT816(1),args_02);
            local_8c8._M_dataplus._M_p = (pointer)s3._0_8_;
            local_8c8._M_string_length._0_1_ = s3[8];
            local_8c8._M_string_length._1_1_ = s3[9];
            local_8c8._M_string_length._2_1_ = s3[10];
            local_8c8._M_string_length._3_1_ = s3[0xb];
            local_8c8._M_string_length._4_1_ = s3[0xc];
            local_8c8._M_string_length._5_1_ = s3[0xd];
            local_8c8._M_string_length._6_1_ = s3[0xe];
            local_8c8._M_string_length._7_1_ = s3[0xf];
            args_08.field_1.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_8c8;
            args_08.desc_ = 0xd;
            fmt_06.size_ = 3;
            fmt_06.data_ = "{}\n";
            ::fmt::v10::vprint(pFVar1,fmt_06,args_08);
            std::__cxx11::string::~string((string *)s3);
            pSVar7 = local_8a0;
LAB_0010a423:
            iVar3 = pSVar7->_args->_extraContent;
            goto LAB_0010a42d;
          }
          local_8c8._M_dataplus._M_p = (local_898->_M_dataplus)._M_p;
          local_8c8._M_string_length = local_898->_M_string_length;
          fmt.size_ = 0xd;
          fmt.data_ = (char *)0x18;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)&local_8c8;
          ::fmt::v10::vformat_abi_cxx11_((string *)s3,(v10 *)"{} : binary file matches",fmt,args_00)
          ;
          local_8c8._M_dataplus._M_p = (pointer)s3._0_8_;
          local_8c8._M_string_length._0_1_ = s3[8];
          local_8c8._M_string_length._1_1_ = s3[9];
          local_8c8._M_string_length._2_1_ = s3[10];
          local_8c8._M_string_length._3_1_ = s3[0xb];
          local_8c8._M_string_length._4_1_ = s3[0xc];
          local_8c8._M_string_length._5_1_ = s3[0xd];
          local_8c8._M_string_length._6_1_ = s3[0xe];
          local_8c8._M_string_length._7_1_ = s3[0xf];
          args_06.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_8c8;
          args_06.desc_ = 0xd;
          fmt_04.size_ = 3;
          fmt_04.data_ = "{}\n";
          ::fmt::v10::vprint(pFVar1,fmt_04,args_06);
LAB_0010a333:
          std::__cxx11::string::~string((string *)s3);
        }
        else {
          if ((local_8a0->_args->_exec)._M_string_length == 0) {
            local_8c8._M_dataplus._M_p = (local_898->_M_dataplus)._M_p;
            local_8c8._M_string_length = local_898->_M_string_length;
            fmt_00.size_ = 0xd;
            fmt_00.data_ = (char *)0x2;
            args_01.field_1.values_ = in_R9.values_;
            args_01.desc_ = (unsigned_long_long)&local_8c8;
            ::fmt::v10::vformat_abi_cxx11_((string *)s3,(v10 *)0x12676d,fmt_00,args_01);
            local_8c8._M_dataplus._M_p = (pointer)s3._0_8_;
            local_8c8._M_string_length._0_1_ = s3[8];
            local_8c8._M_string_length._1_1_ = s3[9];
            local_8c8._M_string_length._2_1_ = s3[10];
            local_8c8._M_string_length._3_1_ = s3[0xb];
            local_8c8._M_string_length._4_1_ = s3[0xc];
            local_8c8._M_string_length._5_1_ = s3[0xd];
            local_8c8._M_string_length._6_1_ = s3[0xe];
            local_8c8._M_string_length._7_1_ = s3[0xf];
            args_07.field_1.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_8c8;
            args_07.desc_ = 0xd;
            fmt_05.size_ = 3;
            fmt_05.data_ = "{}\n";
            ::fmt::v10::vprint(pFVar1,fmt_05,args_07);
            goto LAB_0010a333;
          }
          (*local_8a0->_vptr_Search[4])(local_8a0,&local_8a0->_args->_exec,local_898);
        }
        bVar2 = false;
      }
      else {
LAB_0010a42d:
        pFVar1 = _stdout;
        bVar2 = true;
        if (0 < iVar3) {
          local_8c8._M_dataplus._M_p = buf;
          fmt_02.size_ = 0xc;
          fmt_02.data_ = (char *)0x3;
          args_04.field_1.values_ = in_R9.values_;
          args_04.desc_ = (unsigned_long_long)&local_8c8;
          ::fmt::v10::vformat_abi_cxx11_((string *)s3,(v10 *)"\t{}",fmt_02,args_04);
          local_8c8._M_dataplus._M_p = (pointer)s3._0_8_;
          local_8c8._M_string_length._0_1_ = s3[8];
          local_8c8._M_string_length._1_1_ = s3[9];
          local_8c8._M_string_length._2_1_ = s3[10];
          local_8c8._M_string_length._3_1_ = s3[0xb];
          local_8c8._M_string_length._4_1_ = s3[0xc];
          local_8c8._M_string_length._5_1_ = s3[0xd];
          local_8c8._M_string_length._6_1_ = s3[0xe];
          local_8c8._M_string_length._7_1_ = s3[0xf];
          args_10.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_8c8;
          args_10.desc_ = 0xd;
          fmt_08.size_ = 3;
          fmt_08.data_ = "{}\n";
          ::fmt::v10::vprint(pFVar1,fmt_08,args_10);
          std::__cxx11::string::~string((string *)s3);
          iVar3 = iVar3 + -1;
        }
      }
      std::
      _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&pmatch);
    } while (bVar2);
  }
  std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr(&f);
  return;
}

Assistant:

void Search::findInFile(std::string const & path) const
{
    std::unique_ptr<FILE, decltype(&fclose)> f(Utils::fopen(path.c_str(), "r"), &fclose);
    if (!f) {
        fmt::println(stderr, "{} Failed to open file {} : {}",
                    fmt::styled("ERROR:", fmt::fg(fmt::color::red)),
                    path,
                    Utils::strerror(errno));
        return;
    }

    char buf[BUF_SIZE];
    int lineno = 0;
    bool binary = false;
    int linesToPrint = 0;
    bool const nocolor = _args.noColor();
    while (fgets(buf, BUF_SIZE, f.get()) != nullptr) {
        // Remove trailing CR and LF characters
        size_t sz = strlen(buf);
        while (sz > 0 && (buf[sz - 1] == '\n' || buf[sz - 1] == '\r')) {
            buf[--sz] = '\0';
        }

        // Check for a binary file
        binary = !binary && !_args.ascii() && memchr(buf, 0, sz) != nullptr;

        ++lineno;
        Match pmatch;
        if (_filter.matchContent(buf, &pmatch)) {
            if (_filter.printContent()) {
                if (!binary) {

                    fmt::print("{} +{} : \"", path, lineno);

                    // Print content
                    size_t idx = printMatch(buf, pmatch, nocolor);

                    // Repeat search for more matches
                    while (idx < sz && _filter.matchContent(&buf[idx], &pmatch)) {
                        idx += printMatch(&buf[idx], pmatch, nocolor);
                    }

                    // The remainder of the line
                    if (idx < sz) {
                        char s3[BUF_SIZE];
                        Utils::strncpy_s(s3, BUF_SIZE, &buf[idx], BUF_SIZE - 1);
                        fmt::println("{}\"", s3);
                    }
                    else {
                        fmt::println("\"");
                    }

                    linesToPrint = _args.extraContent();
                }
                else {
                    // Print only file name and exit
                    fmt::println("{} : binary file matches", path);
                    break;
                }
            }
            else if (!_args.execCmd().empty()) {
                // Run the command and exit
                execCmd(_args.execCmd(), path);
                break;
            }
            else {
                // Print only file name and exit
                fmt::println("{}", path);
                break;
            }
        }

        // Print extra content
        if (linesToPrint > 0) {
            fmt::println("\t{}", buf);
            --linesToPrint;
        }
    }
}